

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O3

TextureFormatInfoExt * __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::GetTextureFormatInfoExt
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,TEXTURE_FORMAT TexFormat)

{
  TextureFormatInfoExt *pTVar1;
  pointer pvVar2;
  ushort uVar3;
  _Bit_type *p_Var4;
  ulong uVar5;
  ulong uVar6;
  string msg;
  string local_50;
  
  if (TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB < TexFormat) {
    FormatString<char[28]>(&local_50,(char (*) [28])"Texture format out of range");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"GetTextureFormatInfoExt",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x119);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  uVar6 = (ulong)TexFormat;
  pvVar2 = (this->m_TextureFormatsInfo).
           super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar2[uVar6].super_TextureFormatInfo.super_TextureFormatAttribs.Format != TexFormat) {
    FormatString<char[20]>(&local_50,(char (*) [20])"Sanity check failed");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"GetTextureFormatInfoExt",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x11b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  pTVar1 = pvVar2 + uVar6;
  p_Var4 = (this->m_TexFmtInfoInitFlags).
           super__Bvector_base<Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar3 = TexFormat >> 6;
  uVar5 = p_Var4[uVar3];
  if ((uVar5 >> (uVar6 & 0x3f) & 1) == 0) {
    if ((pTVar1->super_TextureFormatInfo).Supported == true) {
      (*(this->super_ObjectBase<Diligent::IRenderDeviceVk>).
        super_RefCountedObject<Diligent::IRenderDeviceVk>.super_IRenderDeviceVk.super_IRenderDevice.
        super_IObject._vptr_IObject[0x2d])(this,uVar6);
      p_Var4 = (this->m_TexFmtInfoInitFlags).
               super__Bvector_base<Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>.
               _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar5 = p_Var4[uVar3];
    }
    p_Var4[uVar3] = uVar5 | 1L << ((byte)TexFormat & 0x3f);
  }
  return pTVar1;
}

Assistant:

GetTextureFormatInfoExt(TEXTURE_FORMAT TexFormat) override final
    {
        VERIFY(TexFormat >= TEX_FORMAT_UNKNOWN && TexFormat < TEX_FORMAT_NUM_FORMATS, "Texture format out of range");
        const TextureFormatInfoExt& TexFmtInfo = m_TextureFormatsInfo[TexFormat];
        VERIFY(TexFmtInfo.Format == TexFormat, "Sanity check failed");
        if (!m_TexFmtInfoInitFlags[TexFormat])
        {
            if (TexFmtInfo.Supported)
                TestTextureFormat(TexFormat);
            m_TexFmtInfoInitFlags[TexFormat] = true;
        }
        return TexFmtInfo;
    }